

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_server.c
# Opt level: O0

int AdvertiseAndReply(int AdFlag,UpnpDevice_Handle Hnd,SsdpSearchType SearchType,sockaddr *DestAddr,
                     char *DeviceType,char *DeviceUDN,char *ServiceType,int Exp)

{
  int Duration;
  Upnp_Handle_Type UVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  bool local_1fa;
  undefined1 local_1f8 [8];
  timespec req;
  int NumCopy;
  char *dbgStr;
  char *tmpStr;
  IXML_Node *textNode;
  IXML_Node *tmpNode2;
  IXML_Node *tmpNode;
  IXML_NodeList *tmpNodeList;
  IXML_NodeList *nodeList;
  char servType [100];
  char acStack_139 [9];
  char devType [100];
  char local_c8 [8];
  char UDNstr [100];
  Handle_Info *SInfo;
  long lStack_50;
  int defaultExp;
  unsigned_long j;
  unsigned_long i;
  int retVal;
  char *DeviceUDN_local;
  char *DeviceType_local;
  sockaddr *DestAddr_local;
  SsdpSearchType SearchType_local;
  UpnpDevice_Handle Hnd_local;
  int AdFlag_local;
  
  i._4_4_ = 0;
  stack0xffffffffffffffa0 = 0;
  tmpNodeList = (IXML_NodeList *)0x0;
  req.tv_nsec._4_4_ = 0;
  memset(local_c8,0,100);
  memset(acStack_139 + 1,0,100);
  memset(&nodeList,0,100);
  UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x7b,
             "Inside AdvertiseAndReply with AdFlag = %d\n",(ulong)(uint)AdFlag);
  HandleReadLock(".upnp/src/ssdp/ssdp_server.c",0x80);
  UVar1 = GetHandleInfo(Hnd,(Handle_Info **)(UDNstr + 0x60));
  if (UVar1 == HND_DEVICE) {
    Duration = *(int *)(stack0xffffffffffffffa0 + 0x238);
    while( true ) {
      local_1fa = true;
      if (req.tv_nsec._4_4_ != 0) {
        local_1fa = AdFlag != 0 && req.tv_nsec._4_4_ < 2;
      }
      if (!local_1fa) break;
      if (req.tv_nsec._4_4_ != 0) {
        local_1f8 = (undefined1  [8])0x0;
        req.tv_sec = 100000000;
        nanosleep((timespec *)local_1f8,(timespec *)0x0);
      }
      req.tv_nsec._4_4_ = req.tv_nsec._4_4_ + 1;
      j = 0;
      while( true ) {
        UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x8f,
                   "Entering new device list with i = %lu\n\n",j);
        lVar4 = ixmlNodeList_item(*(undefined8 *)(stack0xffffffffffffffa0 + 0x250),j);
        if (lVar4 == 0) break;
        uVar5 = ixmlNode_getNodeName(lVar4);
        UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0xa1,
                   "Extracting device type once for %s\n",uVar5);
        ixmlNodeList_free(tmpNodeList);
        tmpNodeList = (IXML_NodeList *)ixmlElement_getElementsByTagName(lVar4,"deviceType");
        if (tmpNodeList != (IXML_NodeList *)0x0) {
          UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xac,"Extracting UDN for %s\n",
                     uVar5);
          UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xb2,"Extracting device type\n");
          lVar6 = ixmlNodeList_item(tmpNodeList,0);
          if ((lVar6 != 0) && (lVar6 = ixmlNode_getFirstChild(lVar6), lVar6 != 0)) {
            UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xbd,"Extracting device type \n")
            ;
            pcVar7 = (char *)ixmlNode_getNodeValue(lVar6);
            if (pcVar7 != (char *)0x0) {
              strncpy(acStack_139 + 1,pcVar7,99);
              UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xc6,
                         "Extracting device type = %s\n",acStack_139 + 1);
              if (lVar4 == 0) {
                UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xcd,"TempNode is NULL\n");
              }
              uVar5 = ixmlNode_getNodeName(lVar4);
              UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0xd4,"Extracting UDN for %s\n",
                         uVar5);
              ixmlNodeList_free(tmpNodeList);
              tmpNodeList = (IXML_NodeList *)ixmlElement_getElementsByTagName(lVar4,"UDN");
              if (tmpNodeList == (IXML_NodeList *)0x0) {
                UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",0xde,"UDN not found!\n")
                ;
              }
              else {
                lVar6 = ixmlNodeList_item(tmpNodeList,0);
                if (lVar6 == 0) {
                  UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",0xe7,
                             "UDN not found!\n");
                }
                else {
                  lVar6 = ixmlNode_getFirstChild();
                  if (lVar6 == 0) {
                    UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",0xf0,
                               "UDN not found!\n");
                  }
                  else {
                    pcVar7 = (char *)ixmlNode_getNodeValue();
                    if (pcVar7 == (char *)0x0) {
                      UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",0xf9,
                                 "UDN not found!\n");
                    }
                    else {
                      strncpy(local_c8,pcVar7,99);
                      UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x101,
                                 "Sending UDNStr = %s \n",local_c8);
                      if (AdFlag == 0) {
                        switch(SearchType) {
                        case SSDP_ALL:
                          DeviceReply(DestAddr,acStack_139 + 1,(uint)(j == 0),local_c8,
                                      (char *)(stack0xffffffffffffffa0 + 0x1c),Duration,
                                      *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                      *(int *)(stack0xffffffffffffffa0 + 0x240),
                                      *(int *)(stack0xffffffffffffffa0 + 0x244));
                          break;
                        case SSDP_ROOTDEVICE:
                          if (j == 0) {
                            SendReply(DestAddr,acStack_139 + 1,1,local_c8,
                                      (char *)(stack0xffffffffffffffa0 + 0x1c),Duration,0,
                                      *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                      *(int *)(stack0xffffffffffffffa0 + 0x240),
                                      *(int *)(stack0xffffffffffffffa0 + 0x244));
                          }
                          break;
                        case SSDP_DEVICEUDN:
                          if ((DeviceUDN != (char *)0x0) && (sVar8 = strlen(DeviceUDN), sVar8 != 0))
                          {
                            iVar2 = strcasecmp(DeviceUDN,local_c8);
                            if (iVar2 == 0) {
                              UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x13f,
                                         "DeviceUDN=%s and search UDN=%s MATCH\n",local_c8,DeviceUDN
                                        );
                              SendReply(DestAddr,acStack_139 + 1,0,local_c8,
                                        (char *)(stack0xffffffffffffffa0 + 0x1c),Duration,0,
                                        *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                        *(int *)(stack0xffffffffffffffa0 + 0x240),
                                        *(int *)(stack0xffffffffffffffa0 + 0x244));
                            }
                            else {
                              UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x13b,
                                         "DeviceUDN=%s and search UDN=%s DID NOT match\n",local_c8,
                                         DeviceUDN);
                            }
                          }
                          break;
                        case SSDP_DEVICETYPE:
                          sVar8 = strlen(DeviceType);
                          iVar2 = strncasecmp(DeviceType,acStack_139 + 1,sVar8 - 2);
                          if (iVar2 == 0) {
                            pcVar7 = strrchr(DeviceType,0x3a);
                            iVar2 = atoi(pcVar7 + 1);
                            sVar8 = strlen(acStack_139 + 1);
                            iVar3 = atoi(acStack_139 + sVar8);
                            if (iVar2 < iVar3) {
                              UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x153,
                                         "DeviceType=%s and search devType=%s MATCH\n",
                                         acStack_139 + 1,DeviceType);
                              SendReply(DestAddr,DeviceType,0,local_c8,
                                        (char *)(stack0xffffffffffffffa0 + 0xd0),Duration,1,
                                        *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                        *(int *)(stack0xffffffffffffffa0 + 0x240),
                                        *(int *)(stack0xffffffffffffffa0 + 0x244));
                            }
                            else {
                              pcVar7 = strrchr(DeviceType,0x3a);
                              iVar2 = atoi(pcVar7 + 1);
                              sVar8 = strlen(acStack_139 + 1);
                              iVar3 = atoi(acStack_139 + sVar8);
                              if (iVar2 == iVar3) {
                                UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x15d,
                                           "DeviceType=%s and search devType=%s MATCH\n",
                                           acStack_139 + 1,DeviceType);
                                SendReply(DestAddr,DeviceType,0,local_c8,
                                          (char *)(stack0xffffffffffffffa0 + 0x1c),Duration,1,
                                          *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                          *(int *)(stack0xffffffffffffffa0 + 0x240),
                                          *(int *)(stack0xffffffffffffffa0 + 0x244));
                              }
                              else {
                                UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x166,
                                           "DeviceType=%s and search devType=%s DID NOT MATCH\n",
                                           acStack_139 + 1,DeviceType);
                              }
                            }
                          }
                          else {
                            UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x16b,
                                       "DeviceType=%s and search devType=%s DID NOT MATCH\n",
                                       acStack_139 + 1,DeviceType);
                          }
                        }
                      }
                      else if (AdFlag == 1) {
                        DeviceAdvertisement(acStack_139 + 1,(uint)(j == 0),local_c8,
                                            (char *)(stack0xffffffffffffffa0 + 0x1c),Exp,
                                            *(int *)(stack0xffffffffffffffa0 + 0x280),
                                            *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                            *(int *)(stack0xffffffffffffffa0 + 0x240),
                                            *(int *)(stack0xffffffffffffffa0 + 0x244));
                      }
                      else {
                        DeviceShutdown(acStack_139 + 1,(uint)(j == 0),local_c8,
                                       (char *)(stack0xffffffffffffffa0 + 0x1c),Exp,
                                       *(int *)(stack0xffffffffffffffa0 + 0x280),
                                       *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                       *(int *)(stack0xffffffffffffffa0 + 0x240),
                                       *(int *)(stack0xffffffffffffffa0 + 0x244));
                      }
                      UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x17b,
                                 "Sending service Advertisement\n");
                      for (tmpNode2 = (IXML_Node *)ixmlNode_getFirstChild(lVar4);
                          tmpNode = (IXML_Node *)0x0, tmpNode2 != (IXML_Node *)0x0;
                          tmpNode2 = (IXML_Node *)ixmlNode_getNextSibling(tmpNode2)) {
                        pcVar7 = (char *)ixmlNode_getNodeName(tmpNode2);
                        iVar2 = strncmp(pcVar7,"serviceList",0xc);
                        if (iVar2 == 0) break;
                      }
                      ixmlNodeList_free(tmpNodeList);
                      if (tmpNode2 == (IXML_Node *)0x0) {
                        tmpNodeList = (IXML_NodeList *)0x0;
                      }
                      else {
                        tmpNodeList = (IXML_NodeList *)
                                      ixmlElement_getElementsByTagName(tmpNode2,"service");
                        if (tmpNodeList == (IXML_NodeList *)0x0) {
                          UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x196,
                                     "Service not found 3\n");
                        }
                        else {
                          lStack_50 = 0;
                          while (lVar4 = ixmlNodeList_item(tmpNodeList,lStack_50), lVar4 != 0) {
                            ixmlNodeList_free(tmpNode);
                            tmpNode = (IXML_Node *)
                                      ixmlElement_getElementsByTagName(lVar4,"serviceType");
                            if (tmpNode == (IXML_Node *)0x0) {
                              UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/ssdp/ssdp_server.c",0x1a6,
                                         "ServiceType not found \n");
                            }
                            else {
                              lVar4 = ixmlNodeList_item(tmpNode,0);
                              if (((lVar4 != 0) &&
                                  (lVar4 = ixmlNode_getFirstChild(lVar4), lVar4 != 0)) &&
                                 (pcVar7 = (char *)ixmlNode_getNodeValue(lVar4),
                                 pcVar7 != (char *)0x0)) {
                                strncpy((char *)&nodeList,pcVar7,99);
                                UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x1b9,
                                           "ServiceType = %s\n",&nodeList);
                                if (AdFlag == 0) {
                                  if (SearchType == SSDP_ALL) {
                                    ServiceReply(DestAddr,(char *)&nodeList,local_c8,
                                                 (char *)(stack0xffffffffffffffa0 + 0x1c),Duration,
                                                 *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                                 *(int *)(stack0xffffffffffffffa0 + 0x240),
                                                 *(int *)(stack0xffffffffffffffa0 + 0x244));
                                  }
                                  else if ((SearchType == SSDP_SERVICE) &&
                                          (ServiceType != (char *)0x0)) {
                                    sVar8 = strlen(ServiceType);
                                    iVar2 = strncasecmp(ServiceType,(char *)&nodeList,sVar8 - 2);
                                    if (iVar2 == 0) {
                                      pcVar7 = strrchr(ServiceType,0x3a);
                                      iVar2 = atoi(pcVar7 + 1);
                                      sVar8 = strlen((char *)&nodeList);
                                      iVar3 = atoi((char *)((long)&tmpNodeList + sVar8 + 7));
                                      if (iVar2 < iVar3) {
                                        UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",
                                                   0x1e6,
                                                  "ServiceType=%s and search servType=%s MATCH\n",
                                                  ServiceType,&nodeList);
                                        SendReply(DestAddr,ServiceType,0,local_c8,
                                                  (char *)(stack0xffffffffffffffa0 + 0xd0),Duration,
                                                  1,*(int *)(stack0xffffffffffffffa0 + 0x23c),
                                                  *(int *)(stack0xffffffffffffffa0 + 0x240),
                                                  *(int *)(stack0xffffffffffffffa0 + 0x244));
                                      }
                                      else {
                                        pcVar7 = strrchr(ServiceType,0x3a);
                                        iVar2 = atoi(pcVar7 + 1);
                                        sVar8 = strlen((char *)&nodeList);
                                        iVar3 = atoi((char *)((long)&tmpNodeList + sVar8 + 7));
                                        if (iVar2 == iVar3) {
                                          UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",
                                                     0x1f0,
                                                  "ServiceType=%s and search servType=%s MATCH\n",
                                                  ServiceType,&nodeList);
                                          SendReply(DestAddr,ServiceType,0,local_c8,
                                                    (char *)(stack0xffffffffffffffa0 + 0x1c),
                                                    Duration,1,
                                                    *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                                    *(int *)(stack0xffffffffffffffa0 + 0x240),
                                                    *(int *)(stack0xffffffffffffffa0 + 0x244));
                                        }
                                        else {
                                          UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",
                                                     0x1f9,
                                                  "ServiceType=%s and search servType=%s DID NOT MATCH\n"
                                                  ,ServiceType,&nodeList);
                                        }
                                      }
                                    }
                                    else {
                                      UpnpPrintf(UPNP_INFO,API,".upnp/src/ssdp/ssdp_server.c",0x1fe,
                                                 "ServiceType=%s and search servType=%s DID NOT MATCH\n"
                                                 ,ServiceType,&nodeList);
                                    }
                                  }
                                }
                                else if (AdFlag == 1) {
                                  ServiceAdvertisement
                                            (local_c8,(char *)&nodeList,
                                             (char *)(stack0xffffffffffffffa0 + 0x1c),Exp,
                                             *(int *)(stack0xffffffffffffffa0 + 0x280),
                                             *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                             *(int *)(stack0xffffffffffffffa0 + 0x240),
                                             *(int *)(stack0xffffffffffffffa0 + 0x244));
                                }
                                else {
                                  ServiceShutdown(local_c8,(char *)&nodeList,
                                                  (char *)(stack0xffffffffffffffa0 + 0x1c),Exp,
                                                  *(int *)(stack0xffffffffffffffa0 + 0x280),
                                                  *(int *)(stack0xffffffffffffffa0 + 0x23c),
                                                  *(int *)(stack0xffffffffffffffa0 + 0x240),
                                                  *(int *)(stack0xffffffffffffffa0 + 0x244));
                                }
                              }
                            }
                            lStack_50 = lStack_50 + 1;
                          }
                          ixmlNodeList_free(tmpNode);
                          ixmlNodeList_free(tmpNodeList);
                          tmpNodeList = (IXML_NodeList *)0x0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        j = j + 1;
      }
      UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x97,
                 "Exiting new device list with i = %lu\n\n",j);
    }
  }
  else {
    i._4_4_ = -100;
  }
  ixmlNodeList_free(0);
  ixmlNodeList_free(tmpNodeList);
  UpnpPrintf(UPNP_ALL,API,".upnp/src/ssdp/ssdp_server.c",0x217,"Exiting AdvertiseAndReply.\n");
  HandleUnlock(".upnp/src/ssdp/ssdp_server.c",0x219);
  return i._4_4_;
}

Assistant:

int AdvertiseAndReply(int AdFlag,
	UpnpDevice_Handle Hnd,
	enum SsdpSearchType SearchType,
	struct sockaddr *DestAddr,
	char *DeviceType,
	char *DeviceUDN,
	char *ServiceType,
	int Exp)
{
	int retVal = UPNP_E_SUCCESS;
	long unsigned int i;
	long unsigned int j;
	int defaultExp = DEFAULT_MAXAGE;
	struct Handle_Info *SInfo = NULL;
	char UDNstr[100];
	char devType[100];
	char servType[100];
	IXML_NodeList *nodeList = NULL;
	IXML_NodeList *tmpNodeList = NULL;
	IXML_Node *tmpNode = NULL;
	IXML_Node *tmpNode2 = NULL;
	IXML_Node *textNode = NULL;
	const DOMString tmpStr;
	const DOMString dbgStr;
	int NumCopy = 0;

	memset(UDNstr, 0, sizeof(UDNstr));
	memset(devType, 0, sizeof(devType));
	memset(servType, 0, sizeof(servType));

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside AdvertiseAndReply with AdFlag = %d\n",
		AdFlag);

	/* Use a read lock */
	HandleReadLock(__FILE__, __LINE__);
	if (GetHandleInfo(Hnd, &SInfo) != HND_DEVICE) {
		retVal = UPNP_E_INVALID_HANDLE;
		goto end_function;
	}
	defaultExp = SInfo->MaxAge;
	/* parse the device list and send advertisements/replies */
	while (NumCopy == 0 || (AdFlag && NumCopy < NUM_SSDP_COPY)) {
		if (NumCopy != 0)
			imillisleep(SSDP_PAUSE);
		NumCopy++;
		for (i = 0lu;; i++) {
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Entering new device list with i = %lu\n\n",
				i);
			tmpNode = ixmlNodeList_item(SInfo->DeviceList, i);
			if (!tmpNode) {
				UpnpPrintf(UPNP_ALL,
					API,
					__FILE__,
					__LINE__,
					"Exiting new device list with i = "
					"%lu\n\n",
					i);
				break;
			}
			dbgStr = ixmlNode_getNodeName(tmpNode);
			UpnpPrintf(UPNP_INFO,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type once for %s\n",
				dbgStr);
			ixmlNodeList_free(nodeList);
			nodeList = ixmlElement_getElementsByTagName(
				(IXML_Element *)tmpNode, "deviceType");
			if (!nodeList)
				continue;
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting UDN for %s\n",
				dbgStr);
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type\n");
			tmpNode2 = ixmlNodeList_item(nodeList, 0lu);
			if (!tmpNode2)
				continue;
			textNode = ixmlNode_getFirstChild(tmpNode2);
			if (!textNode)
				continue;
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type \n");
			tmpStr = ixmlNode_getNodeValue(textNode);
			if (!tmpStr)
				continue;
			strncpy(devType, tmpStr, sizeof(devType) - 1);
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting device type = %s\n",
				devType);
			if (!tmpNode) {
				UpnpPrintf(UPNP_ALL,
					API,
					__FILE__,
					__LINE__,
					"TempNode is NULL\n");
			}
			dbgStr = ixmlNode_getNodeName(tmpNode);
			UpnpPrintf(UPNP_ALL,
				API,
				__FILE__,
				__LINE__,
				"Extracting UDN for %s\n",
				dbgStr);
			ixmlNodeList_free(nodeList);
			nodeList = ixmlElement_getElementsByTagName(
				(IXML_Element *)tmpNode, "UDN");
			if (!nodeList) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			tmpNode2 = ixmlNodeList_item(nodeList, 0lu);
			if (!tmpNode2) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			textNode = ixmlNode_getFirstChild(tmpNode2);
			if (!textNode) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			tmpStr = ixmlNode_getNodeValue(textNode);
			if (!tmpStr) {
				UpnpPrintf(UPNP_CRITICAL,
					API,
					__FILE__,
					__LINE__,
					"UDN not found!\n");
				continue;
			}
			strncpy(UDNstr, tmpStr, sizeof(UDNstr) - 1);
			UpnpPrintf(UPNP_INFO,
				API,
				__FILE__,
				__LINE__,
				"Sending UDNStr = %s \n",
				UDNstr);
			if (AdFlag) {
				/* send the device advertisement */
				if (AdFlag == 1) {
					DeviceAdvertisement(devType,
						i == 0lu,
						UDNstr,
						SInfo->DescURL,
						Exp,
						SInfo->DeviceAf,
						SInfo->PowerState,
						SInfo->SleepPeriod,
						SInfo->RegistrationState);
				} else {
					/* AdFlag == -1 */
					DeviceShutdown(devType,
						i == 0lu,
						UDNstr,
						SInfo->DescURL,
						Exp,
						SInfo->DeviceAf,
						SInfo->PowerState,
						SInfo->SleepPeriod,
						SInfo->RegistrationState);
				}
			} else {
				switch (SearchType) {
				case SSDP_ALL:
					DeviceReply(DestAddr,
						devType,
						i == 0lu,
						UDNstr,
						SInfo->DescURL,
						defaultExp,
						SInfo->PowerState,
						SInfo->SleepPeriod,
						SInfo->RegistrationState);
					break;
				case SSDP_ROOTDEVICE:
					if (i == 0lu) {
						SendReply(DestAddr,
							devType,
							1,
							UDNstr,
							SInfo->DescURL,
							defaultExp,
							0,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
					}
					break;
				case SSDP_DEVICEUDN: {
					/* clang-format off */
					if (DeviceUDN && strlen(DeviceUDN) != (size_t)0) {
						if (strcasecmp(DeviceUDN, UDNstr)) {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								"DeviceUDN=%s and search UDN=%s DID NOT match\n",
								UDNstr, DeviceUDN);
						} else {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								"DeviceUDN=%s and search UDN=%s MATCH\n",
								UDNstr, DeviceUDN);
							SendReply(DestAddr, devType, 0, UDNstr, SInfo->DescURL, defaultExp, 0,
								SInfo->PowerState,
								SInfo->SleepPeriod,
								SInfo->RegistrationState);
						}
					}
					/* clang-format on */
					break;
				}
				case SSDP_DEVICETYPE: {
					/* clang-format off */
					if (!strncasecmp(DeviceType, devType, strlen(DeviceType) - (size_t)2)) {
						if (atoi(strrchr(DeviceType, ':') + 1)
						    < atoi(&devType[strlen(devType) - (size_t)1])) {
							/* the requested version is lower than the device version
							 * must reply with the lower version number and the lower
							 * description URL */
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								   "DeviceType=%s and search devType=%s MATCH\n",
								   devType, DeviceType);
							SendReply(DestAddr, DeviceType, 0, UDNstr, SInfo->LowerDescURL,
								  defaultExp, 1,
								  SInfo->PowerState,
								  SInfo->SleepPeriod,
								  SInfo->RegistrationState);
						} else if (atoi(strrchr(DeviceType, ':') + 1)
							   == atoi(&devType[strlen(devType) - (size_t)1])) {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								   "DeviceType=%s and search devType=%s MATCH\n",
								   devType, DeviceType);
							SendReply(DestAddr, DeviceType, 0, UDNstr, SInfo->DescURL,
								  defaultExp, 1,
								  SInfo->PowerState,
								  SInfo->SleepPeriod,
								  SInfo->RegistrationState);
						} else {
							UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
								   "DeviceType=%s and search devType=%s DID NOT MATCH\n",
								   devType, DeviceType);
						}
					} else {
						UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
							   "DeviceType=%s and search devType=%s DID NOT MATCH\n",
							   devType, DeviceType);
					}
					/* clang-format on */
					break;
				}
				default:
					break;
				}
			}
			/* send service advertisements for services
			 * corresponding to the same device */
			UpnpPrintf(UPNP_INFO,
				API,
				__FILE__,
				__LINE__,
				"Sending service Advertisement\n");
			/* Correct service traversal such that each device's
			 * serviceList is directly traversed as a child of its
			 * parent device. This ensures that the service's alive
			 * message uses the UDN of the parent device. */
			tmpNode = ixmlNode_getFirstChild(tmpNode);
			while (tmpNode) {
				dbgStr = ixmlNode_getNodeName(tmpNode);
				if (!strncmp(dbgStr,
					    SERVICELIST_STR,
					    sizeof SERVICELIST_STR)) {
					break;
				}
				tmpNode = ixmlNode_getNextSibling(tmpNode);
			}
			ixmlNodeList_free(nodeList);
			if (!tmpNode) {
				nodeList = NULL;
				continue;
			}
			nodeList = ixmlElement_getElementsByTagName(
				(IXML_Element *)tmpNode, "service");
			if (!nodeList) {
				UpnpPrintf(UPNP_INFO,
					API,
					__FILE__,
					__LINE__,
					"Service not found 3\n");
				continue;
			}
			for (j = 0lu;; j++) {
				tmpNode = ixmlNodeList_item(nodeList, j);
				if (!tmpNode) {
					break;
				}
				ixmlNodeList_free(tmpNodeList);
				tmpNodeList = ixmlElement_getElementsByTagName(
					(IXML_Element *)tmpNode, "serviceType");
				if (!tmpNodeList) {
					UpnpPrintf(UPNP_CRITICAL,
						API,
						__FILE__,
						__LINE__,
						"ServiceType not found \n");
					continue;
				}
				tmpNode2 = ixmlNodeList_item(tmpNodeList, 0lu);
				if (!tmpNode2)
					continue;
				textNode = ixmlNode_getFirstChild(tmpNode2);
				if (!textNode)
					continue;
				/* servType is of format
				 * Servicetype:ServiceVersion */
				tmpStr = ixmlNode_getNodeValue(textNode);
				if (!tmpStr)
					continue;
				strncpy(servType, tmpStr, sizeof(servType) - 1);
				UpnpPrintf(UPNP_INFO,
					API,
					__FILE__,
					__LINE__,
					"ServiceType = %s\n",
					servType);
				if (AdFlag) {
					if (AdFlag == 1) {
						ServiceAdvertisement(UDNstr,
							servType,
							SInfo->DescURL,
							Exp,
							SInfo->DeviceAf,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
					} else {
						/* AdFlag == -1 */
						ServiceShutdown(UDNstr,
							servType,
							SInfo->DescURL,
							Exp,
							SInfo->DeviceAf,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
					}
				} else {
					switch (SearchType) {
					case SSDP_ALL:
						ServiceReply(DestAddr,
							servType,
							UDNstr,
							SInfo->DescURL,
							defaultExp,
							SInfo->PowerState,
							SInfo->SleepPeriod,
							SInfo->RegistrationState);
						break;
					case SSDP_SERVICE:
						/* clang-format off */
						if (ServiceType) {
							if (!strncasecmp(ServiceType, servType, strlen(ServiceType) - (size_t)2)) {
								if (atoi(strrchr(ServiceType, ':') + 1) <
								    atoi(&servType[strlen(servType) - (size_t)1])) {
									/* the requested version is lower than the service version
									 * must reply with the lower version number and the lower
									 * description URL */
									UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
										   "ServiceType=%s and search servType=%s MATCH\n",
										   ServiceType, servType);
									SendReply(DestAddr, ServiceType, 0, UDNstr, SInfo->LowerDescURL,
										  defaultExp, 1,
										  SInfo->PowerState,
										  SInfo->SleepPeriod,
										  SInfo->RegistrationState);
								} else if (atoi(strrchr (ServiceType, ':') + 1) ==
									   atoi(&servType[strlen(servType) - (size_t)1])) {
									UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
										   "ServiceType=%s and search servType=%s MATCH\n",
										   ServiceType, servType);
									SendReply(DestAddr, ServiceType, 0, UDNstr, SInfo->DescURL,
										  defaultExp, 1,
										  SInfo->PowerState,
										  SInfo->SleepPeriod,
										  SInfo->RegistrationState);
								} else {
									UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
									   "ServiceType=%s and search servType=%s DID NOT MATCH\n",
									   ServiceType, servType);
								}
							} else {
								UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__,
									   "ServiceType=%s and search servType=%s DID NOT MATCH\n",
									   ServiceType, servType);
							}
						}
						/* clang-format on */
						break;
					default:
						break;
					}
				}
			}
			ixmlNodeList_free(tmpNodeList);
			tmpNodeList = NULL;
			ixmlNodeList_free(nodeList);
			nodeList = NULL;
		}
	}

end_function:
	ixmlNodeList_free(tmpNodeList);
	ixmlNodeList_free(nodeList);
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting AdvertiseAndReply.\n");
	HandleUnlock(__FILE__, __LINE__);

	return retVal;
}